

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar;
  ImU32 tab_id;
  long lVar1;
  
  lVar1 = (long)(GImGui->CurrentTabBar).Size;
  if ((0 < lVar1) &&
     (tab_bar = (GImGui->CurrentTabBar).Data[lVar1 + -1], (tab_bar->Flags & 0x100000) == 0)) {
    tab_id = TabBarCalcTabID(tab_bar,label);
    TabBarRemoveTab(tab_bar,tab_id);
    return;
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = (g.CurrentTabBar.Size > 0) && !(g.CurrentTabBar.back()->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}